

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined4 uVar8;
  Vector<float,_3> res_1;
  Type in0;
  Matrix<float,_3,_2> res;
  Vec4 *local_18;
  int local_10 [4];
  
  pfVar1 = (float *)&in0;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar4 != lVar5) {
          uVar8 = 0;
        }
        pfVar1[lVar5 * 2] = (float)uVar8;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pfVar1 = pfVar1 + 1;
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    puVar3 = &s_constInMat3x2;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar1[lVar5 * 2] = (float)puVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
  }
  pfVar1 = (float *)&res;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[2] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[2] = 0.0;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar6) = uVar8;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 == 0xc);
    lVar5 = lVar5 + 1;
    pfVar1 = pfVar1 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar5 != 3);
  pVVar2 = (Vector<float,_3> *)&res;
  pfVar1 = (float *)&in0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      ((Vector<tcu::Vector<float,_3>,_2> *)pVVar2->m_data)->m_data[0].m_data[lVar5] =
           pfVar1[lVar5 * 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    pVVar2 = pVVar2 + 1;
    pfVar1 = pfVar1 + 1;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar4 = 0;
  do {
    res_1.m_data[lVar4] = res.m_data.m_data[0].m_data[lVar4] + res.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_18 = &evalCtx->color;
  local_10[0] = 0;
  local_10[1] = 1;
  local_10[2] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_18 + lVar4 * 4)] = res_1.m_data[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}